

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataType.cpp
# Opt level: O1

vector<long,_std::allocator<long>_> *
CoreML::defaultShapeOf
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,ArrayFeatureType *params)

{
  iterator iVar1;
  uint64 *puVar2;
  ArrayFeatureType_EnumeratedShapes *pAVar3;
  Type *pTVar4;
  LogMessage *pLVar5;
  long *plVar6;
  int i;
  int iVar7;
  RepeatedField<long> *this;
  LogFinisher local_a9;
  long local_a8;
  LogMessage local_a0;
  LogMessage local_68;
  
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((params->shape_).current_size_ < 1) {
    if (params->_oneof_case_[0] == 0x15) {
      iVar7 = 0;
      while( true ) {
        if (params->_oneof_case_[0] == 0x15) {
          pAVar3 = (params->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar3 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
        }
        if ((pAVar3->shapes_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5c6);
          pLVar5 = google::protobuf::internal::LogMessage::operator<<
                             (&local_68,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=((LogFinisher *)&local_a8,pLVar5);
          google::protobuf::internal::LogMessage::~LogMessage(&local_68);
        }
        if (*(int *)((long)((pAVar3->shapes_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x10)
            <= iVar7) break;
        if (params->_oneof_case_[0] == 0x15) {
          pAVar3 = (params->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar3 = Specification::ArrayFeatureType_EnumeratedShapes::default_instance();
        }
        if ((pAVar3->shapes_).super_RepeatedPtrFieldBase.current_size_ < 1) {
          google::protobuf::internal::LogMessage::LogMessage
                    (&local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x5c6);
          pLVar5 = google::protobuf::internal::LogMessage::operator<<
                             (&local_a0,"CHECK failed: (index) < (current_size_): ");
          google::protobuf::internal::LogFinisher::operator=(&local_a9,pLVar5);
          google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
        }
        plVar6 = google::protobuf::RepeatedField<long>::Get
                           ((RepeatedField<long> *)
                            ((long)((pAVar3->shapes_).super_RepeatedPtrFieldBase.rep_)->elements[0]
                            + 0x10),iVar7);
        local_a8 = *plVar6;
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (__return_storage_ptr__,iVar1,&local_a8);
        }
        else {
          *iVar1._M_current = local_a8;
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar7 = iVar7 + 1;
      }
    }
    else if (params->_oneof_case_[0] == 0x1f) {
      iVar7 = 0;
      while( true ) {
        if (params->_oneof_case_[0] == 0x1f) {
          pAVar3 = (params->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar3 = (ArrayFeatureType_EnumeratedShapes *)
                   Specification::ArrayFeatureType_ShapeRange::default_instance();
        }
        if ((((RepeatedPtrField<CoreML::Specification::SizeRange> *)&pAVar3->shapes_)->
            super_RepeatedPtrFieldBase).current_size_ <= iVar7) break;
        if (params->_oneof_case_[0] == 0x1f) {
          pAVar3 = (params->ShapeFlexibility_).enumeratedshapes_;
        }
        else {
          pAVar3 = (ArrayFeatureType_EnumeratedShapes *)
                   Specification::ArrayFeatureType_ShapeRange::default_instance();
        }
        pTVar4 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::SizeRange>::TypeHandler>
                           ((RepeatedPtrFieldBase *)&pAVar3->shapes_,iVar7);
        local_a0._0_8_ = pTVar4->lowerbound_;
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (__return_storage_ptr__,iVar1,(long *)&local_a0);
        }
        else {
          *iVar1._M_current = local_a0._0_8_;
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar7 = iVar7 + 1;
      }
    }
  }
  else {
    this = &params->shape_;
    if (0 < this->current_size_) {
      iVar7 = 0;
      do {
        puVar2 = (uint64 *)google::protobuf::RepeatedField<long>::Get(this,iVar7);
        local_a0._0_8_ = *puVar2;
        iVar1._M_current =
             (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar1._M_current ==
            (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                    (__return_storage_ptr__,iVar1,(long *)&local_a0);
        }
        else {
          *iVar1._M_current = local_a0._0_8_;
          (__return_storage_ptr__->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
          super__Vector_impl_data._M_finish = iVar1._M_current + 1;
        }
        iVar7 = iVar7 + 1;
      } while (iVar7 < this->current_size_);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<int64_t> defaultShapeOf(const Specification::ArrayFeatureType &params) {
        std::vector<int64_t> defaultShape;
        if (params.shape_size() > 0) {
            for (int i = 0; i<params.shape_size(); i++) {
                defaultShape.push_back((int64_t)params.shape(i));
            }
            return defaultShape;
        }

        switch (params.ShapeFlexibility_case()) {
            case Specification::ArrayFeatureType::kEnumeratedShapes: {
                for (int i = 0; i < params.enumeratedshapes().shapes(0).shape_size(); i++) {
                    defaultShape.push_back((int64_t)params.enumeratedshapes().shapes(0).shape(i));
                }
                break;
            }
            case Specification::ArrayFeatureType::kShapeRange: {
                for (int i=0; i < params.shaperange().sizeranges_size(); i++) {
                    defaultShape.push_back((int64_t)params.shaperange().sizeranges(i).lowerbound());
                }
                break;
            }
            case Specification::ArrayFeatureType::SHAPEFLEXIBILITY_NOT_SET:
                break;
        }

        return defaultShape;
    }